

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pages.c
# Opt level: O2

void * os_pages_map(void *addr,size_t size,size_t alignment,_Bool *commit)

{
  void *addr_00;
  int __prot;
  void *pvVar1;
  
  if (os_overcommits) {
    *(undefined1 *)alignment = 1;
    __prot = 3;
  }
  else {
    __prot = (*(byte *)alignment & 1) * 3;
  }
  addr_00 = mmap(addr,size,__prot,mmap_flags,-1,0);
  pvVar1 = (void *)0x0;
  if (((addr_00 != (void *)0xffffffffffffffff) && (pvVar1 = addr_00, addr != (void *)0x0)) &&
     (addr_00 != addr)) {
    os_pages_unmap(addr_00,size);
    pvVar1 = (void *)0x0;
  }
  return pvVar1;
}

Assistant:

static void *
os_pages_map(void *addr, size_t size, size_t alignment, bool *commit) {
	assert(ALIGNMENT_ADDR2BASE(addr, os_page) == addr);
	assert(ALIGNMENT_CEILING(size, os_page) == size);
	assert(size != 0);

	if (os_overcommits) {
		*commit = true;
	}

	void *ret;
#ifdef _WIN32
	/*
	 * If VirtualAlloc can't allocate at the given address when one is
	 * given, it fails and returns NULL.
	 */
	ret = VirtualAlloc(addr, size, MEM_RESERVE | (*commit ? MEM_COMMIT : 0),
	    PAGE_READWRITE);
#else
	/*
	 * We don't use MAP_FIXED here, because it can cause the *replacement*
	 * of existing mappings, and we only want to create new mappings.
	 */
	{
		int flags = mmap_flags;
#ifdef __NetBSD__
		/*
		 * On NetBSD PAGE for a platform is defined to the
		 * maximum page size of all machine architectures
		 * for that platform, so that we can use the same
		 * binaries across all machine architectures.
		 */
		if (alignment > os_page || PAGE > os_page) {
			unsigned int a = ilog2(MAX(alignment, PAGE));
			flags |= MAP_ALIGNED(a);
		}
#endif
		int prot = *commit ? PAGES_PROT_COMMIT : PAGES_PROT_DECOMMIT;

		ret = mmap(addr, size, prot, flags, PAGES_FD_TAG, 0);
	}
	assert(ret != NULL);

	if (ret == MAP_FAILED) {
		ret = NULL;
	} else if (addr != NULL && ret != addr) {
		/*
		 * We succeeded in mapping memory, but not in the right place.
		 */
		os_pages_unmap(ret, size);
		ret = NULL;
	}
#endif
	assert(ret == NULL || (addr == NULL && ret != addr) || (addr != NULL &&
	    ret == addr));
#ifdef JEMALLOC_PAGEID
	int n = os_page_id(ret, size,
	    os_overcommits ? "jemalloc_pg_overcommit" : "jemalloc_pg");
	assert(n == 0 || (n == -1 && get_errno() == EINVAL));
#endif
	return ret;
}